

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableType.hpp
# Opt level: O3

int rsg::getTypeConstructorDepth(VariableType *type)

{
  pointer pMVar1;
  VariableType *type_00;
  int iVar2;
  int iVar3;
  pointer pMVar4;
  
  if (type->m_baseType - TYPE_FLOAT < 3) {
    return 2;
  }
  if (type->m_baseType == TYPE_STRUCT) {
    pMVar4 = (type->m_members).
             super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar1 = (type->m_members).
             super__Vector_base<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar4 == pMVar1) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
      do {
        type_00 = pMVar4->m_type;
        if (type_00->m_baseType - TYPE_FLOAT < 3) {
          iVar2 = (type_00->m_numElements != 1) + 1;
        }
        else {
          iVar2 = 0;
          if (type_00->m_baseType == TYPE_STRUCT) {
            iVar2 = getTypeConstructorDepth(type_00);
          }
        }
        if (iVar2 < iVar3) {
          iVar2 = iVar3;
        }
        iVar3 = iVar2;
        pMVar4 = pMVar4 + 1;
      } while (pMVar4 != pMVar1);
      iVar3 = iVar3 + 1;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

Type								getBaseType			(void) const	{ return m_baseType;			}